

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::AppendGlobalGeneratorsDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  pointer ppcVar1;
  bool bVar2;
  bool bVar3;
  pointer ppcVar4;
  cmDocumentationEntry e;
  string defaultName;
  cmDocumentationEntry local_a0;
  char *local_58 [4];
  pointer local_38;
  
  EvaluateDefaultGlobalGenerator((cmake *)&stack0xffffffffffffffc8);
  (*(code *)(*local_38)[3]._vptr_cmGlobalGeneratorFactory)(local_58);
  ppcVar1 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = false;
  for (ppcVar4 = (this->Generators).
                 super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1;
      ppcVar4 = ppcVar4 + 1) {
    local_a0.Name._M_dataplus._M_p = (pointer)&local_a0.Name.field_2;
    local_a0.Name._M_string_length = 0;
    local_a0.Name.field_2._M_local_buf[0] = '\0';
    local_a0.Brief._M_dataplus._M_p = (pointer)&local_a0.Brief.field_2;
    local_a0.Brief._M_string_length = 0;
    local_a0.Brief.field_2._M_local_buf[0] = '\0';
    local_a0.CustomNamePrefix = ' ';
    (*(*ppcVar4)->_vptr_cmGlobalGeneratorFactory[3])(*ppcVar4,&local_a0);
    bVar2 = !bVar3;
    bVar3 = true;
    if (bVar2) {
      bVar2 = cmsys::SystemTools::StringStartsWith(&local_a0.Name,local_58[0]);
      if (bVar2) {
        local_a0.CustomNamePrefix = '*';
      }
      else {
        bVar3 = false;
      }
    }
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
    emplace_back<cmDocumentationEntry>(v,&local_a0);
    cmDocumentationEntry::~cmDocumentationEntry(&local_a0);
  }
  std::__cxx11::string::~string((string *)local_58);
  (*(code *)(*local_38)[1]._vptr_cmGlobalGeneratorFactory)();
  return;
}

Assistant:

void cmake::AppendGlobalGeneratorsDocumentation(
  std::vector<cmDocumentationEntry>& v)
{
  const auto defaultGenerator = this->EvaluateDefaultGlobalGenerator();
  const std::string defaultName = defaultGenerator->GetName();
  bool foundDefaultOne = false;

  for (cmGlobalGeneratorFactory* g : this->Generators) {
    cmDocumentationEntry e;
    g->GetDocumentation(e);
    if (!foundDefaultOne &&
        cmSystemTools::StringStartsWith(e.Name, defaultName.c_str())) {
      e.CustomNamePrefix = '*';
      foundDefaultOne = true;
    }
    v.push_back(std::move(e));
  }
}